

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2ParallelRead.cpp
# Opt level: O1

expected<idx2::chunk_exp_cache,_idx2::idx2_err_code> *
idx2::ParallelReadChunkExponents
          (expected<idx2::chunk_exp_cache,_idx2::idx2_err_code> *__return_storage_ptr__,
          idx2_file *Idx2,decode_data *D,u64 Brick,i8 Level,i8 Subband)

{
  undefined8 uVar1;
  char *pcVar2;
  u64 *puVar3;
  byte *pbVar4;
  i64 iVar5;
  allocator *paVar6;
  byte *pbVar7;
  u64 uVar8;
  undefined4 uVar9;
  decode_data *pdVar10;
  bool bVar11;
  __off_t _Var12;
  __off_t _Var13;
  ulong uVar14;
  FILE *pFVar15;
  long lVar16;
  name_map *pnVar17;
  idx2_err_code iVar18;
  byte bVar19;
  unsigned_long *Key;
  long lVar20;
  char cVar21;
  int iVar22;
  chunk_exp_cache *pcVar23;
  undefined8 uVar24;
  ulong uVar25;
  undefined7 in_register_00000081;
  chunk_exp_cache *Val;
  undefined7 in_register_00000089;
  ulong uVar26;
  expected<idx2::chunk_exp_cache,_idx2::idx2_err_code> *peVar27;
  uint uVar28;
  int iVar29;
  size_t sVar30;
  uint uVar31;
  long *in_FS_OFFSET;
  error<idx2::idx2_err_code> eVar32;
  int S;
  int ChunkAddrsSz;
  int NChunks;
  int ExponentSize;
  scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_idx2ParallelRead_cpp:370:5)>
  __ScopeGuard__370;
  file_id FileId;
  iterator FileCacheIt;
  scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_idx2ParallelRead_cpp:249:3)>
  __ScopeGuard__249;
  scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_idx2ParallelRead_cpp:243:3)>
  __ScopeGuard__243;
  scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_idx2ParallelRead_cpp:240:3)>
  __ScopeGuard__240;
  u64 ChunkAddr;
  u64 ChunkAddress;
  unique_lock<std::mutex> Lock;
  timer IOTimer;
  timer IOTimer_1;
  file_cache FileCache;
  chunk_exp_cache ChunkExpCache;
  int local_2a4;
  decode_data *local_2a0;
  expected<idx2::chunk_exp_cache,_idx2::idx2_err_code> *local_298;
  int local_290;
  uint local_28c;
  FILE *local_288;
  idx2_file *local_280;
  undefined4 local_278;
  uint local_274;
  int local_270;
  int local_26c;
  buffer local_268;
  chunk_exp_cache *local_248;
  anon_union_8_2_2df48d06_for_stref_0 local_240 [2];
  undefined1 local_230 [16];
  bucket_status *local_220;
  long local_218;
  long local_210;
  buffer *local_208;
  char local_200;
  buffer *local_1f8;
  char local_1f0;
  buffer *local_1e8;
  char local_1e0;
  u64 local_1d8;
  undefined1 local_1d0 [16];
  bucket_status *pbStack_1c0;
  undefined8 *local_1b8;
  undefined1 local_1a8 [40];
  undefined1 local_180;
  timespec local_178;
  iterator local_168;
  undefined1 local_148 [96];
  hash_table<unsigned_long,_idx2::chunk_exp_cache> local_e8;
  array<int> local_b8;
  undefined8 local_88;
  timespec local_70;
  undefined8 uStack_60;
  undefined8 *local_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined4 local_40;
  undefined1 local_38;
  
  local_1a8._32_8_ = &D->FileCacheMutex;
  local_180 = 0;
  local_298 = __return_storage_ptr__;
  std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)(local_1a8 + 0x20));
  local_180 = 1;
  local_274 = (uint)CONCAT71(in_register_00000081,Level);
  Key = (unsigned_long *)(CONCAT71(in_register_00000081,Level) & 0xffffffff);
  local_278 = (undefined4)CONCAT71(in_register_00000089,Subband);
  local_280 = Idx2;
  local_1d8 = Brick;
  ConstructFilePath((file_id *)local_240,Idx2,Brick,(i8)Key,Subband,0);
  Lookup<unsigned_long,idx2::file_cache>
            ((iterator *)(local_230 + 8),(idx2 *)&D->FileCacheTable,
             (hash_table<unsigned_long,_idx2::file_cache> *)local_230,Key);
  clock_gettime(1,&local_178);
  if ((*(char *)(*(long *)(local_218 + 0x10) + local_210) == '\x02') &&
     (local_220[200] == Tombstone)) {
    *(char **)(*in_FS_OFFSET + -0xb80) =
         "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2ParallelRead.cpp"
    ;
    *(undefined4 *)(*in_FS_OFFSET + -0x980) = 0xe1;
    cVar21 = '\0';
    peVar27 = local_298;
  }
  else {
    pFVar15 = fopen(local_240[0].Ptr,"rb");
    peVar27 = local_298;
    if (pFVar15 == (FILE *)0x0) {
      *(char **)(*in_FS_OFFSET + -0xb80) =
           "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2ParallelRead.cpp"
      ;
      *(undefined4 *)(*in_FS_OFFSET + -0x980) = 0xe4;
      pnVar17 = &idx2_err_code_s::NameMap;
      iVar18 = idx2_err_code_s::NameMap.Arr[0].ItemVal;
      if (idx2_err_code_s::NameMap.Arr[0].ItemVal != FileNotFound) {
        lVar16 = 0x28;
        do {
          if (lVar16 == 0x3b8) {
            iVar18 = __Invalid__;
            goto LAB_00197111;
          }
          pcVar2 = (char *)((long)&idx2_err_code_s::NameMap.Arr[0].Name.field_0 + lVar16);
          lVar16 = lVar16 + 0x18;
        } while (*pcVar2 != '%');
        iVar18 = FileNotFound;
      }
LAB_00197111:
      if (idx2_err_code_s::NameMap.Arr[0].ItemVal != iVar18) {
        lVar16 = 0;
        do {
          lVar20 = lVar16;
          if (lVar20 == 0x390) goto LAB_00197878;
          lVar16 = lVar20 + 0x18;
        } while ((&idx2_err_code_s::NameMap.Arr[1].ItemVal)[lVar20] != iVar18);
        pnVar17 = (name_map *)((long)&idx2_err_code_s::NameMap.Arr[1].Name.field_0 + lVar20);
      }
      lVar16 = *in_FS_OFFSET;
      iVar22 = snprintf((char *)(lVar16 + -0xf80),0x400,"%.*s (file %s, line %d): ",
                        (ulong)(uint)pnVar17->Arr[0].Name.Size,pnVar17->Arr[0].Name.field_0.Ptr,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2ParallelRead.cpp"
                        ,0xe4);
      snprintf((char *)(lVar16 + -0xf80) + iVar22,0x400 - (long)iVar22,"File: %s",local_240[0].Ptr);
      cVar21 = '%';
    }
    else {
      fseeko(pFVar15,0,2);
      _Var12 = ftello(pFVar15);
      local_26c = 0;
      _Var13 = ftello(pFVar15);
      fseeko(pFVar15,_Var13 + -4,0);
      fread(&local_26c,4,1,pFVar15);
      fseeko(pFVar15,_Var13 + -4,0);
      local_28c = 0;
      _Var13 = ftello(pFVar15);
      fseeko(pFVar15,_Var13 + -4,0);
      fread(&local_28c,4,1,pFVar15);
      fseeko(pFVar15,_Var13 + -4,0);
      _Var13 = ftello(pFVar15);
      fseeko(pFVar15,_Var13 + -4,0);
      fread(&local_290,4,1,pFVar15);
      fseeko(pFVar15,_Var13 + -4,0);
      if (Mallocator()::Instance == '\0') {
        ParallelReadChunkExponents();
      }
      local_1e8 = &local_268;
      local_268.Data = (byte *)0x0;
      local_268.Bytes = 0;
      local_268.Alloc = (allocator *)&Mallocator()::Instance;
      local_1e0 = '\0';
      lVar16 = (long)local_290;
      if (Mallocator()::Instance == '\0') {
        ParallelReadChunkExponents();
      }
      local_288 = pFVar15;
      AllocBuf(&local_268,lVar16,(allocator *)&Mallocator()::Instance);
      sVar30 = (size_t)local_290;
      if (local_268.Bytes < (long)sVar30) {
LAB_0019789a:
        __assert_fail("Sz <= Size(*Buf)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/InputOutput.h"
                      ,0x9d,"void idx2::ReadBackwardBuffer(FILE *, buffer *, i64)");
      }
      _Var13 = ftello(pFVar15);
      fseeko(pFVar15,_Var13 - sVar30,0);
      fread(local_268.Data,sVar30,1,pFVar15);
      fseeko(pFVar15,_Var13 - sVar30,0);
      LOCK();
      (D->BytesData_).super___atomic_base<unsigned_long>._M_i =
           (D->BytesData_).super___atomic_base<unsigned_long>._M_i + sVar30;
      UNLOCK();
      if (Mallocator()::Instance == '\0') {
        ParallelReadChunkExponents();
      }
      local_1f8 = (buffer *)local_1a8;
      local_1a8._0_8_ = (allocator *)0x0;
      local_1a8._8_8_ = (chunk_exp_cache *)0x0;
      local_1a8._16_8_ = &Mallocator()::Instance;
      local_1f0 = '\0';
      lVar16 = (long)(int)local_28c;
      if (Mallocator()::Instance == '\0') {
        ParallelReadChunkExponents();
      }
      AllocBuf((buffer *)local_1a8,lVar16 << 3,(allocator *)&Mallocator()::Instance);
      DecompressBufZstd(&local_268,(buffer *)local_1a8);
      local_2a4 = 0;
      _Var13 = ftello(pFVar15);
      fseeko(pFVar15,_Var13 + -4,0);
      fread(&local_2a4,4,1,pFVar15);
      fseeko(pFVar15,_Var13 + -4,0);
      if (Mallocator()::Instance == '\0') {
        ParallelReadChunkExponents();
      }
      local_208 = (buffer *)(local_1d0 + 8);
      local_1d0._8_8_ = (chunk_exp_cache *)0x0;
      pbStack_1c0 = (bucket_status *)0x0;
      local_1b8 = &Mallocator()::Instance;
      local_200 = '\0';
      lVar16 = (long)local_2a4;
      if (Mallocator()::Instance == '\0') {
        ParallelReadChunkExponents();
      }
      AllocBuf((buffer *)(local_1d0 + 8),lVar16,(allocator *)&Mallocator()::Instance);
      sVar30 = (size_t)local_2a4;
      if ((long)pbStack_1c0 < (long)sVar30) goto LAB_0019789a;
      _Var13 = ftello(pFVar15);
      fseeko(pFVar15,_Var13 - sVar30,0);
      fread((void *)local_1d0._8_8_,sVar30,1,pFVar15);
      fseeko(pFVar15,_Var13 - sVar30,0);
      LOCK();
      (D->BytesExps_).super___atomic_base<unsigned_long>._M_i =
           (D->BytesExps_).super___atomic_base<unsigned_long>._M_i + sVar30 + 4;
      UNLOCK();
      clock_gettime(1,(timespec *)local_148);
      LOCK();
      (D->DecodeIOTime_).super___atomic_base<unsigned_long>._M_i =
           (D->DecodeIOTime_).super___atomic_base<unsigned_long>._M_i +
           (long)((double)(local_148._0_8_ - local_178.tv_sec) * 1000000000.0 +
                 (double)(local_148._8_8_ - local_178.tv_nsec));
      UNLOCK();
      local_2a0 = D;
      if (Mallocator()::Instance == '\0') {
        ParallelReadChunkExponents();
      }
      local_248 = (chunk_exp_cache *)local_1d0._8_8_;
      uVar14 = *(ulong *)local_1d0._8_8_;
      file_cache::file_cache((file_cache *)local_148);
      if (Mallocator()::Instance == '\0') {
        ParallelReadChunkExponents();
      }
      Init<unsigned_long,idx2::chunk_exp_cache>
                ((hash_table<unsigned_long,_idx2::chunk_exp_cache> *)(local_148 + 0x60),10,
                 (allocator *)&Mallocator()::Instance);
      iVar22 = local_2a4;
      local_88 = _Var12 - local_26c;
      GrowCapacity<int>((array<int> *)(local_148 + 0x90),(long)local_2a4);
      uVar26 = 0;
      if (0 < iVar22) {
        uVar31 = 0;
        iVar22 = 0;
        pcVar23 = local_248;
        do {
          bVar19 = 0;
          lVar16 = 0;
          do {
            if (0x39 < (int)uVar31) {
              uVar14 = *(ulong *)((long)&pcVar23->ChunkPos + (ulong)(uVar31 >> 3));
              pcVar23 = (chunk_exp_cache *)((long)&pcVar23->ChunkPos + (ulong)(uVar31 >> 3));
              uVar31 = uVar31 & 7;
            }
            uVar25 = uVar14 >> ((byte)uVar31 & 0x3f);
            uVar28 = uVar31 + 7;
            if (0x38 < (int)uVar31) {
              uVar14 = *(ulong *)((long)&pcVar23->ChunkPos + (ulong)(uVar28 >> 3));
              pcVar23 = (chunk_exp_cache *)((long)&pcVar23->ChunkPos + (ulong)(uVar28 >> 3));
              uVar28 = uVar28 & 7;
            }
            Val = (chunk_exp_cache *)(uVar14 >> ((byte)uVar28 & 0x3f));
            lVar16 = lVar16 + ((uVar25 & bitstream::Masks.Arr[7]) << (bVar19 & 0x3f));
            uVar31 = uVar28 + 1;
            bVar19 = bVar19 + 7;
          } while (((ulong)Val & bitstream::Masks.Arr[1]) != 0);
          local_270 = iVar22;
          if (local_b8.Capacity <= local_b8.Size) {
            GrowCapacity<int>((array<int> *)(local_148 + 0x90),0);
          }
          iVar22 = local_270 + (int)lVar16;
          uVar1 = local_b8.Size + Tombstone;
          *(int *)(local_b8.Buffer.Data + local_b8.Size * 4) = iVar22;
          local_1d0._0_8_ = ((allocator *)(local_1a8._0_8_ + uVar26 * 8))->_vptr_allocator;
          local_b8.Size = uVar1;
          if (Mallocator()::Instance == '\0') {
            ParallelReadChunkExponents();
          }
          local_70.tv_nsec = 0;
          uStack_60 = 0;
          local_58 = &Mallocator()::Instance;
          local_50 = 0;
          uStack_48 = 0;
          local_40 = 0;
          local_38 = 0;
          local_70.tv_sec._0_4_ = (undefined4)uVar26;
          Insert<unsigned_long,idx2::chunk_exp_cache>
                    (&local_168,(idx2 *)(local_148 + 0x60),
                     (hash_table<unsigned_long,_idx2::chunk_exp_cache> *)local_1d0,
                     (unsigned_long *)&local_70,Val);
          uVar26 = uVar26 + 1;
          iVar29 = uVar28 + 0xf;
          if (-1 < (int)(uVar28 + 8)) {
            iVar29 = uVar28 + 8;
          }
        } while ((long)pcVar23 + ((long)(iVar29 >> 3) - (long)local_248) < (long)local_2a4);
      }
      pFVar15 = local_288;
      uVar31 = local_28c;
      peVar27 = local_298;
      D = local_2a0;
      if (local_28c == (uint)uVar26) {
        if ((long)(int)local_28c % (local_280->Subbands).Size != 0) {
          *(char **)(*in_FS_OFFSET + -0xb80) =
               "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2ParallelRead.cpp"
          ;
          *(undefined4 *)(*in_FS_OFFSET + -0x980) = 0x11c;
          pnVar17 = &idx2_err_code_s::NameMap;
          iVar18 = idx2_err_code_s::NameMap.Arr[0].ItemVal;
          if (idx2_err_code_s::NameMap.Arr[0].ItemVal != SizeMismatched) {
            lVar16 = 0x28;
            do {
              if (lVar16 == 0x3b8) {
                iVar18 = __Invalid__;
                goto LAB_001972cb;
              }
              pcVar2 = (char *)((long)&idx2_err_code_s::NameMap.Arr[0].Name.field_0 + lVar16);
              lVar16 = lVar16 + 0x18;
            } while (*pcVar2 != '\x04');
            iVar18 = SizeMismatched;
          }
LAB_001972cb:
          if (idx2_err_code_s::NameMap.Arr[0].ItemVal != iVar18) {
            lVar16 = 0;
            do {
              lVar20 = lVar16;
              if (lVar20 == 0x390) goto LAB_00197878;
              lVar16 = lVar20 + 0x18;
            } while ((&idx2_err_code_s::NameMap.Arr[1].ItemVal)[lVar20] != iVar18);
            pnVar17 = (name_map *)((long)&idx2_err_code_s::NameMap.Arr[1].Name.field_0 + lVar20);
          }
          lVar16 = *in_FS_OFFSET;
          iVar22 = snprintf((char *)(lVar16 + -0xf80),0x400,"%.*s (file %s, line %d): ",
                            (ulong)(uint)pnVar17->Arr[0].Name.Size,pnVar17->Arr[0].Name.field_0.Ptr,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2ParallelRead.cpp"
                            ,0x11c);
          snprintf((char *)(lVar16 + -0xf80) + iVar22,0x400 - (long)iVar22,
                   "number of chunks = %d is not divisible by number of subbands which is %d\n",
                   (ulong)uVar31,(ulong)(uint)(local_280->Subbands).Size);
          goto LAB_00197371;
        }
        if (*(char *)(*(long *)(local_218 + 0x10) + local_210) == '\x02') {
          *(undefined8 *)(local_220 + 0xc0) = local_88;
          *(byte **)(local_220 + 0x90) = local_b8.Buffer.Data;
          *(i64 *)(local_220 + 0x98) = local_b8.Buffer.Bytes;
          *(allocator **)(local_220 + 0xa0) = local_b8.Buffer.Alloc;
          *(i64 *)(local_220 + 0xa8) = local_b8.Size;
          *(allocator **)(local_220 + 0xa0) = local_b8.Buffer.Alloc;
          *(i64 *)(local_220 + 0xa8) = local_b8.Size;
          *(i64 *)(local_220 + 0xb0) = local_b8.Capacity;
          *(allocator **)(local_220 + 0xb8) = local_b8.Alloc;
          *(unsigned_long **)(local_220 + 0x60) = local_e8.Keys;
          *(chunk_exp_cache **)(local_220 + 0x68) = local_e8.Vals;
          *(bucket_status **)(local_220 + 0x70) = local_e8.Stats;
          *(i64 *)(local_220 + 0x78) = local_e8.Size;
          *(bucket_status **)(local_220 + 0x70) = local_e8.Stats;
          *(i64 *)(local_220 + 0x78) = local_e8.Size;
          *(i64 *)(local_220 + 0x80) = local_e8.LogCapacity;
          *(allocator **)(local_220 + 0x88) = local_e8.Alloc;
        }
        else {
          Insert<unsigned_long,idx2::file_cache>
                    ((iterator *)(local_230 + 8),(unsigned_long *)local_230,(file_cache *)local_148)
          ;
        }
        local_220[200] = Tombstone;
        *(char **)(*in_FS_OFFSET + -0xb80) =
             "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2ParallelRead.cpp"
        ;
        *(undefined4 *)(*in_FS_OFFSET + -0x980) = 0x12e;
        cVar21 = '\0';
      }
      else {
        *(char **)(*in_FS_OFFSET + -0xb80) =
             "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2ParallelRead.cpp"
        ;
        *(undefined4 *)(*in_FS_OFFSET + -0x980) = 0x115;
        pnVar17 = &idx2_err_code_s::NameMap;
        iVar18 = idx2_err_code_s::NameMap.Arr[0].ItemVal;
        if (idx2_err_code_s::NameMap.Arr[0].ItemVal != SizeMismatched) {
          lVar16 = 0x28;
          do {
            if (lVar16 == 0x3b8) {
              iVar18 = __Invalid__;
              goto LAB_001971bf;
            }
            pcVar2 = (char *)((long)&idx2_err_code_s::NameMap.Arr[0].Name.field_0 + lVar16);
            lVar16 = lVar16 + 0x18;
          } while (*pcVar2 != '\x04');
          iVar18 = SizeMismatched;
        }
LAB_001971bf:
        if (idx2_err_code_s::NameMap.Arr[0].ItemVal != iVar18) {
          lVar16 = 0;
          do {
            lVar20 = lVar16;
            if (lVar20 == 0x390) goto LAB_00197878;
            lVar16 = lVar20 + 0x18;
          } while ((&idx2_err_code_s::NameMap.Arr[1].ItemVal)[lVar20] != iVar18);
          pnVar17 = (name_map *)((long)&idx2_err_code_s::NameMap.Arr[1].Name.field_0 + lVar20);
        }
        lVar16 = *in_FS_OFFSET;
        iVar22 = snprintf((char *)(lVar16 + -0xf80),0x400,"%.*s (file %s, line %d): ",
                          (ulong)(uint)pnVar17->Arr[0].Name.Size,pnVar17->Arr[0].Name.field_0.Ptr,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2ParallelRead.cpp"
                          ,0x115);
        snprintf((char *)(lVar16 + -0xf80) + iVar22,0x400 - (long)iVar22,
                 "number of chunks is either %d or %d\n",(ulong)uVar31,uVar26 & 0xffffffff);
        peVar27 = local_298;
LAB_00197371:
        cVar21 = '\x04';
        D = local_2a0;
        pFVar15 = local_288;
      }
      if (local_200 == '\0') {
        DeallocBuf(local_208);
      }
      if (local_1f0 == '\0') {
        DeallocBuf(local_1f8);
      }
      if (local_1e0 == '\0') {
        DeallocBuf(local_1e8);
      }
    }
    if (pFVar15 != (FILE *)0x0) {
      fclose(pFVar15);
    }
  }
  if ((cVar21 == '\0') && (*(char *)(*(long *)(local_218 + 0x10) + local_210) == '\x02')) {
    if ('\x0f' < (char)local_274) {
      __assert_fail("Idx < N",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                    ,0x20c,"t &idx2::stack_array<int, 16>::operator[](int) const [t = int, N = 16]")
      ;
    }
    uVar14 = (ulong)(local_280->BricksPerChunk).Arr[(char)local_274];
    lVar16 = 0x3f;
    if (uVar14 != 0) {
      for (; uVar14 >> lVar16 == 0; lVar16 = lVar16 + -1) {
      }
    }
    bVar19 = -(uVar14 == 0) | (byte)lVar16;
    local_1a8._0_8_ =
         (long)((int)(char)local_278 << 0xc) + ((ulong)(local_274 & 0xff) << 0x3c) +
         (local_1d8 >> ((1L << (bVar19 & 0x3f) != uVar14) + bVar19 & 0x3f)) * 0x40000;
    Lookup<unsigned_long,idx2::chunk_exp_cache>
              ((iterator *)local_148,(idx2 *)(local_220 + 0x60),
               (hash_table<unsigned_long,_idx2::chunk_exp_cache> *)local_1a8,
               (unsigned_long *)local_1a8._0_8_);
    uVar1 = local_148._8_8_;
    if ((*(bucket_status **)(local_148._16_8_ + 0x10))[local_148._24_8_] == Occupied) {
      local_2a0 = D;
      if ((((bitstream *)(local_148._8_8_ + 8))->Stream).Bytes == 0) {
        clock_gettime(1,(timespec *)&local_168);
        pFVar15 = fopen(local_240[0].Ptr,"rb");
        if (pFVar15 == (FILE *)0x0) {
          local_148._0_8_ = local_240;
          eVar32 = ParallelReadChunkExponents::anon_class_8_1_1e916d15::operator()
                             ((anon_class_8_1_1e916d15 *)local_148);
          peVar27->_vptr_expected = (_func_int **)&PTR__expected_001d0b30;
          (peVar27->field_1).Err.Msg = eVar32.Msg;
          *(short *)((long)&peVar27->field_1 + 8) = eVar32._8_2_;
          (peVar27->field_1).Err.StrGened = eVar32.StrGened;
          peVar27->Ok = false;
        }
        else {
          lVar16 = (long)*(i32 *)uVar1;
          uVar24 = *(undefined8 *)(local_220 + 0xc0);
          iVar22 = *(int *)(*(undefined8 *)(local_220 + 0x90) + lVar16 * 4);
          if (0 < lVar16) {
            iVar29 = *(int *)((*(undefined8 *)(local_220 + 0x90) - 4) + lVar16 * 4);
            uVar24 = uVar24 + (long)iVar29;
            iVar22 = iVar22 - iVar29;
          }
          fseeko(pFVar15,uVar24,0);
          if (Mallocator()::Instance == '\0') {
            ParallelReadChunkExponents();
          }
          local_148._0_8_ = (anon_union_8_2_2df48d06_for_stref_0 *)0x0;
          local_148._8_8_ = (chunk_exp_cache *)0x0;
          local_148._16_8_ = &Mallocator()::Instance;
          local_268.Bytes = local_268.Bytes & 0xffffffffffffff00;
          sVar30 = (size_t)iVar22;
          local_268.Data = (byte *)local_148;
          if (Mallocator()::Instance == '\0') {
            ParallelReadChunkExponents();
          }
          AllocBuf((buffer *)local_148,sVar30,(allocator *)&Mallocator()::Instance);
          fread((void *)local_148._0_8_,sVar30,1,pFVar15);
          DecompressBufZstd((buffer *)local_148,(bitstream *)(uVar1 + 8));
          pdVar10 = local_2a0;
          LOCK();
          (local_2a0->BytesDecoded_).super___atomic_base<unsigned_long>._M_i =
               (local_2a0->BytesDecoded_).super___atomic_base<unsigned_long>._M_i + sVar30;
          UNLOCK();
          LOCK();
          (local_2a0->BytesExps_).super___atomic_base<unsigned_long>._M_i =
               (local_2a0->BytesExps_).super___atomic_base<unsigned_long>._M_i + sVar30;
          UNLOCK();
          clock_gettime(1,&local_70);
          LOCK();
          (pdVar10->DecodeIOTime_).super___atomic_base<unsigned_long>._M_i =
               (pdVar10->DecodeIOTime_).super___atomic_base<unsigned_long>._M_i +
               (long)((double)(CONCAT44(local_70.tv_sec._4_4_,(undefined4)local_70.tv_sec) -
                              (long)local_168.Key) * 1000000000.0 +
                     (double)(local_70.tv_nsec - (long)local_168.Val));
          UNLOCK();
          puVar3 = (u64 *)(((bitstream *)(uVar1 + 8))->Stream).Data;
          ((bitstream *)(uVar1 + 8))->BitPtr = (byte *)puVar3;
          ((bitstream *)(uVar1 + 8))->BitPos = 0;
          ((bitstream *)(uVar1 + 8))->BitBuf = 0;
          ((bitstream *)(uVar1 + 8))->BitBuf = *puVar3;
          ((bitstream *)(uVar1 + 8))->BitPos = 0;
          if ((char)local_268.Bytes == '\0') {
            DeallocBuf((buffer *)local_268.Data);
          }
        }
        if (pFVar15 == (FILE *)0x0) goto LAB_0019776d;
        fclose(pFVar15);
      }
      peVar27->_vptr_expected = (_func_int **)&PTR__expected_001d0b30;
      pbVar4 = (((bitstream *)(uVar1 + 8))->Stream).Data;
      iVar5 = (((bitstream *)(uVar1 + 8))->Stream).Bytes;
      paVar6 = (((bitstream *)(uVar1 + 8))->Stream).Alloc;
      pbVar7 = ((bitstream *)(uVar1 + 8))->BitPtr;
      uVar8 = ((bitstream *)(uVar1 + 8))->BitBuf;
      iVar22 = ((bitstream *)(uVar1 + 8))->BitPos;
      uVar9 = *(undefined4 *)&((bitstream *)(uVar1 + 8))->field_0x2c;
      uVar24 = *(undefined8 *)(uVar1 + 0x38);
      (peVar27->field_1).Err.Msg = *(cstr *)uVar1;
      (peVar27->field_1).Val.ChunkExpStream.Stream.Data = pbVar4;
      (peVar27->field_1).Val.ChunkExpStream.Stream.Bytes = iVar5;
      (peVar27->field_1).Val.ChunkExpStream.Stream.Alloc = paVar6;
      (peVar27->field_1).Val.ChunkExpStream.BitPtr = pbVar7;
      (peVar27->field_1).Val.ChunkExpStream.BitBuf = uVar8;
      *(int *)((long)&peVar27->field_1 + 0x30) = iVar22;
      *(undefined4 *)((long)&peVar27->field_1 + 0x34) = uVar9;
      *(undefined8 *)((long)&peVar27->field_1 + 0x38) = uVar24;
      bVar11 = true;
    }
    else {
      *(char **)(*in_FS_OFFSET + -0xb80) =
           "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2ParallelRead.cpp"
      ;
      *(undefined4 *)(*in_FS_OFFSET + -0x980) = 0x15d;
      peVar27->_vptr_expected = (_func_int **)&PTR__expected_001d0b30;
      (peVar27->field_1).Err.Msg = "";
      (peVar27->field_1).Err.StrGened = false;
      *(undefined2 *)((long)&peVar27->field_1 + 8) = 0x23;
      bVar11 = false;
    }
    peVar27->Ok = bVar11;
  }
  else {
    *(char **)(*in_FS_OFFSET + -0xb80) =
         "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2ParallelRead.cpp"
    ;
    *(undefined4 *)(*in_FS_OFFSET + -0x980) = 0x154;
    pnVar17 = &idx2_err_code_s::NameMap;
    iVar18 = idx2_err_code_s::NameMap.Arr[0].ItemVal;
    if (idx2_err_code_s::NameMap.Arr[0].ItemVal != FileNotFound) {
      lVar16 = 0x28;
      do {
        if (lVar16 == 0x3b8) {
          iVar18 = __Invalid__;
          goto LAB_001976ac;
        }
        pcVar2 = (char *)((long)&idx2_err_code_s::NameMap.Arr[0].Name.field_0 + lVar16);
        lVar16 = lVar16 + 0x18;
      } while (*pcVar2 != '%');
      iVar18 = FileNotFound;
    }
LAB_001976ac:
    if (idx2_err_code_s::NameMap.Arr[0].ItemVal != iVar18) {
      lVar16 = 0;
      do {
        lVar20 = lVar16;
        if (lVar20 == 0x390) {
LAB_00197878:
          __assert_fail("It != End(EnumS.NameMap)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Common.h"
                        ,0x38,"stref idx2::ToString(idx2_err_code)");
        }
        lVar16 = lVar20 + 0x18;
      } while ((&idx2_err_code_s::NameMap.Arr[1].ItemVal)[lVar20] != iVar18);
      pnVar17 = (name_map *)((long)&idx2_err_code_s::NameMap.Arr[1].Name.field_0 + lVar20);
    }
    lVar16 = *in_FS_OFFSET;
    iVar22 = snprintf((char *)(lVar16 + -0xf80),0x400,"%.*s (file %s, line %d): ",
                      (ulong)(uint)pnVar17->Arr[0].Name.Size,pnVar17->Arr[0].Name.field_0.Ptr,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2ParallelRead.cpp"
                      ,0x154);
    snprintf((char *)(lVar16 + -0xf80) + iVar22,0x400 - (long)iVar22,"File: %s\n",local_240[0].Ptr);
    peVar27->_vptr_expected = (_func_int **)&PTR__expected_001d0b30;
    (peVar27->field_1).Err.Msg = "File: %s\n";
    (peVar27->field_1).Err.StrGened = true;
    *(undefined2 *)((long)&peVar27->field_1 + 8) = 0x25;
    peVar27->Ok = false;
  }
LAB_0019776d:
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)(local_1a8 + 0x20));
  return peVar27;
}

Assistant:

expected<chunk_exp_cache, idx2_err_code>
ParallelReadChunkExponents(const idx2_file& Idx2, decode_data* D, u64 Brick, i8 Level, i8 Subband)
{
#if VISUS_IDX2
  if (Idx2.external_read)
  {
    std::unique_lock<std::mutex> Lock(D->FileCacheMutex);
    u64 ChunkAddress = GetChunkAddress(Idx2, Brick, Level, Subband, ExponentBitPlane_);
    auto ChunkExpCacheIt = Lookup(D->FileCache.ChunkExpCaches, ChunkAddress);
    if (ChunkExpCacheIt)
      return *ChunkExpCacheIt.Val;

    // here we release he lock and read the chunk
    // read the block
    buffer buff;
    bool Result = Idx2.external_read(Idx2, buff, ChunkAddress).get();
    idx2_ReturnErrorIf(!Result, idx2_err_code::ChunkNotFound);

    // decompress the block
    chunk_exp_cache ChunkExpCache;
    bitstream& ChunkExpStream = ChunkExpCache.ChunkExpStream;
    DecompressBufZstd(buff, &ChunkExpStream);
    InitRead(&ChunkExpCache.ChunkExpStream, ChunkExpStream.Stream);
    Insert(&ChunkExpCacheIt, ChunkAddress, ChunkExpCache);
    return *ChunkExpCacheIt.Val;
  }
#endif
  std::unique_lock<std::mutex> Lock(D->FileCacheMutex);
  file_id FileId = ConstructFilePath(Idx2, Brick, Level, Subband, ExponentBitPlane_);
  auto FileCacheIt = Lookup(D->FileCacheTable, FileId.Id);
  auto Result = ParallelReadFileExponents(Idx2, D, Level, &FileCacheIt, FileId);
  if (!Result || !FileCacheIt)
    return idx2_Error(idx2_err_code::FileNotFound, "File: %s\n", FileId.Name.ConstPtr);

  /* find the appropriate chunk */
  u64 ChunkAddress = GetChunkAddress(Idx2, Brick, Level, Subband, ExponentBitPlane_);
  file_cache* FileCache = FileCacheIt.Val;
  decltype(FileCache->ChunkExpCaches)::iterator ChunkCacheIt;
  // TODO: lock and be careful about invalidated pointer
  ChunkCacheIt = Lookup(FileCache->ChunkExpCaches, ChunkAddress);
  if (!ChunkCacheIt)
    return idx2_Error(idx2_err_code::ChunkNotFound);

  chunk_exp_cache* ChunkExpCache = ChunkCacheIt.Val;
  if (Size(ChunkExpCache->ChunkExpStream.Stream) == 0) // chunk has not been loaded
  {
    timer IOTimer;
    StartTimer(&IOTimer);
    idx2_RAII(FILE*, Fp = fopen(FileId.Name.ConstPtr, "rb"), , if (Fp) fclose(Fp));
    if (!Fp)
      return idx2_Error(idx2_err_code::FileNotFound, "File: %s\n", FileId.Name.ConstPtr);
    i32 ChunkPos = ChunkExpCache->ChunkPos;
    i64 ChunkExpOffset = FileCache->ExponentBeginOffset;
    i32 ChunkExpSize = FileCache->ChunkExpOffsets[ChunkPos];
    if (ChunkPos > 0)
    {
      i32 PrevChunkOffset = FileCache->ChunkExpOffsets[ChunkPos - 1];
      ChunkExpOffset += PrevChunkOffset;
      ChunkExpSize -= PrevChunkOffset;
    }
    idx2_FSeek(Fp, ChunkExpOffset, SEEK_SET);
    bitstream& ChunkExpStream = ChunkExpCache->ChunkExpStream;
    idx2_ScopeBuffer(CompressedChunkExpsBuf, ChunkExpSize);
    ReadBuffer(Fp, &CompressedChunkExpsBuf, ChunkExpSize);
    DecompressBufZstd(CompressedChunkExpsBuf, &ChunkExpStream);
    D->BytesDecoded_ += ChunkExpSize;
    D->BytesExps_ += ChunkExpSize;
    D->DecodeIOTime_ += ElapsedTime(&IOTimer);
    InitRead(&ChunkExpStream, ChunkExpStream.Stream);
  }

  return *ChunkCacheIt.Val;
}